

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

anytype_t * ps_config_set_str(ps_config_t *config,char *name,char *val)

{
  anytype_t *paVar1;
  cmd_ln_val_t *cval;
  char *val_local;
  char *name_local;
  ps_config_t *config_local;
  
  config_local = (ps_config_t *)cmd_ln_access_r(config,name);
  if ((anytype_t *)config_local == (anytype_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
            ,0x2c9,"Unknown parameter %s\n",name);
    config_local = (ps_config_t *)0x0;
  }
  else {
    paVar1 = anytype_from_str((anytype_t *)config_local,*(int *)((long)config_local + 8),val);
    if (paVar1 == (anytype_t *)0x0) {
      config_local = (ps_config_t *)0x0;
    }
  }
  return (anytype_t *)config_local;
}

Assistant:

const anytype_t *
ps_config_set_str(ps_config_t *config, char const *name, char const *val)
{
    cmd_ln_val_t *cval = cmd_ln_access_r(config, name);
    if (cval == NULL) {
        E_ERROR("Unknown parameter %s\n", name);
        return NULL;
    }
    if (anytype_from_str(&cval->val, cval->type, val) == NULL) {
        return NULL;
    }
    return &cval->val;
}